

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cba.h
# Opt level: O0

void Cba_ObjSetFinFon(Cba_Ntk_t *p,int i,int k,int x)

{
  int iVar1;
  int x_local;
  int k_local;
  int i_local;
  Cba_Ntk_t *p_local;
  
  if (i < 1) {
    __assert_fail("i>0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cba.h"
                  ,0x16e,"void Cba_ObjSetFinFon(Cba_Ntk_t *, int, int, int)");
  }
  iVar1 = Cba_ObjFinFon(p,i,k);
  if (iVar1 == 0) {
    iVar1 = Cba_ObjFin(p,i,k);
    Vec_IntWriteEntry(&p->vFinFon,iVar1,x);
    return;
  }
  __assert_fail("Cba_ObjFinFon(p, i, k)== 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cba.h"
                ,0x16e,"void Cba_ObjSetFinFon(Cba_Ntk_t *, int, int, int)");
}

Assistant:

static inline void           Cba_ObjSetFinFon( Cba_Ntk_t * p, int i, int k, int x ) { assert(i>0); assert(Cba_ObjFinFon(p, i, k)== 0); Vec_IntWriteEntry(&p->vFinFon, Cba_ObjFin(p, i, k), x); }